

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::FboRenderTestGroup::init(FboRenderTestGroup *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  int extraout_EAX;
  TestCaseGroup *pTVar4;
  TestNode *pTVar5;
  MixTest *this_00;
  BlendTest *this_01;
  IntersectingQuadsTest *this_02;
  StencilTest *this_03;
  TestNode *node;
  TestNode *pTVar6;
  long lVar7;
  int depthbufferNdx;
  long lVar8;
  long lVar9;
  int local_98;
  FboConfig local_68;
  TestNode *local_50;
  long local_48;
  undefined8 uStack_40;
  long local_38;
  
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar4,(this->super_TestCaseGroup).m_context,"color_clear","Color buffer clears");
  local_50 = (TestNode *)this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        pTVar5 = (TestNode *)operator_new(0x90);
        FboCases::ColorClearsTest::ColorClearsTest
                  ((ColorClearsTest *)pTVar5,pTVar4->m_context,&local_68);
        tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"stencil_clear","Stencil buffer clears");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType != 0) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::StencilClearsTest::StencilClearsTest
                    ((StencilClearsTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"color","Color buffer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (((int)lVar1 == 0xde1) && (local_68.stencilbufferType == 0)) {
          this_00 = (MixTest *)operator_new(0xa0);
          FboCases::MixTest::MixTest(this_00,pTVar4->m_context,&local_68,false);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_00);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (((int)lVar1 == 0xde1) && (local_68.stencilbufferType == 0)) {
          pTVar5 = (TestNode *)operator_new(0xa0);
          FboCases::MixNpotTest::MixNpotTest((MixNpotTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType == 0) {
          this_01 = (BlendTest *)operator_new(0x98);
          FboCases::BlendTest::BlendTest(this_01,pTVar4->m_context,&local_68,false);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_01);
        }
      }
    }
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType == 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::BlendNpotTest::BlendNpotTest
                    ((BlendNpotTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"depth","Depth bufer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (((GLenum)uVar2 != 0) && (local_68.stencilbufferType == 0)) {
          this_02 = (IntersectingQuadsTest *)operator_new(0x98);
          FboCases::IntersectingQuadsTest::IntersectingQuadsTest
                    (this_02,pTVar4->m_context,&local_68,false);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_02);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (((GLenum)uVar2 != 0) && (local_68.stencilbufferType == 0)) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::IntersectingQuadsNpotTest::IntersectingQuadsNpotTest
                    ((IntersectingQuadsNpotTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"stencil","Stencil buffer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType != 0) {
          this_03 = (StencilTest *)operator_new(0x98);
          FboCases::StencilTest::StencilTest(this_03,pTVar4->m_context,&local_68,false);
          tcu::TestNode::addChild((TestNode *)pTVar4,(TestNode *)this_03);
        }
      }
    }
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType != 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::StencilNpotTest::StencilNpotTest
                    ((StencilNpotTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"shared_colorbuffer_clear",
             "Shared colorbuffer clears");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    uStack_40 = 0;
    local_48 = lVar1;
    local_38 = lVar7;
    for (lVar8 = 0; lVar7 = local_48, lVar8 != 2; lVar8 = lVar8 + 1) {
      local_98 = (int)lVar1;
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar7;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType == 0 && ((GLenum)uVar2 == 0 && local_98 != 0)) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::SharedColorbufferClearsTest::SharedColorbufferClearsTest
                    ((SharedColorbufferClearsTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_38 + 1;
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"shared_colorbuffer",
             "Shared colorbuffer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        pTVar5 = (TestNode *)operator_new(0x90);
        FboCases::SharedColorbufferTest::SharedColorbufferTest
                  ((SharedColorbufferTest *)pTVar5,pTVar4->m_context,&local_68);
        tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"shared_depthbuffer",
             "Shared depthbuffer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if ((GLenum)uVar2 == 0x8d41) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::SharedDepthbufferTest::SharedDepthbufferTest
                    ((SharedDepthbufferTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"resize","FBO resize tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        pTVar5 = (TestNode *)operator_new(0x90);
        FboCases::ResizeTest::ResizeTest((ResizeTest *)pTVar5,pTVar4->m_context,&local_68);
        tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"recreate_colorbuffer",
             "Recreate colorbuffer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if ((int)lVar1 != 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::RecreateBuffersRebindTest<16384U>::RecreateBuffersRebindTest
                    ((RecreateBuffersRebindTest<16384U> *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if ((int)lVar1 != 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::RecreateBuffersNoRebindTest<16384U>::RecreateBuffersNoRebindTest
                    ((RecreateBuffersNoRebindTest<16384U> *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"recreate_depthbuffer",
             "Recreate depthbuffer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if ((GLenum)uVar2 != 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::RecreateBuffersRebindTest<256U>::RecreateBuffersRebindTest
                    ((RecreateBuffersRebindTest<256U> *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  lVar7 = 0;
  while (lVar7 != 5) {
    lVar1 = (&DAT_0182e810)[lVar7];
    local_48 = lVar7;
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar7);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if ((GLenum)uVar2 != 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::RecreateBuffersNoRebindTest<256U>::RecreateBuffersNoRebindTest
                    ((RecreateBuffersNoRebindTest<256U> *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
    lVar7 = local_48 + 1;
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"recreate_stencilbuffer",
             "Recreate stencilbuffer tests");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType != 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::RecreateBuffersRebindTest<1024U>::RecreateBuffersRebindTest
                    ((RecreateBuffersRebindTest<1024U> *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        if (local_68.stencilbufferType != 0) {
          pTVar5 = (TestNode *)operator_new(0x98);
          FboCases::RecreateBuffersNoRebindTest<1024U>::RecreateBuffersNoRebindTest
                    ((RecreateBuffersNoRebindTest<1024U> *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
  }
  pTVar4 = (TestCaseGroup *)operator_new(0x78);
  pTVar5 = local_50;
  TestCaseGroup::TestCaseGroup
            (pTVar4,(Context *)local_50[1]._vptr_TestNode,"texsubimage",
             "TexSubImage interop with FBO colorbuffer texture");
  tcu::TestNode::addChild(pTVar5,(TestNode *)pTVar4);
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        bVar3 = FboCases::TexSubImageAfterRenderTest::isConfigSupported(&local_68);
        if (bVar3) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::TexSubImageAfterRenderTest::TexSubImageAfterRenderTest
                    ((TexSubImageAfterRenderTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
  }
  for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
    lVar1 = (&DAT_0182e810)[lVar7];
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      uVar2 = (&DAT_0182e8a0)[lVar8];
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 8) {
        local_68._16_8_ = *(undefined8 *)((long)&DAT_0182e8b0 + lVar9);
        local_68._0_8_ = lVar1;
        local_68._8_8_ = uVar2;
        bVar3 = FboCases::TexSubImageBetweenRenderTest::isConfigSupported(&local_68);
        if (bVar3) {
          pTVar5 = (TestNode *)operator_new(0x90);
          FboCases::TexSubImageBetweenRenderTest::TexSubImageBetweenRenderTest
                    ((TexSubImageBetweenRenderTest *)pTVar5,pTVar4->m_context,&local_68);
          tcu::TestNode::addChild((TestNode *)pTVar4,pTVar5);
        }
      }
    }
  }
  node = (TestNode *)operator_new(0x70);
  pTVar5 = local_50;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,local_50->m_testCtx,"repeated_clear","Repeated FBO clears");
  tcu::TestNode::addChild(pTVar5,node);
  pTVar6 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar6,(Context *)pTVar5[1]._vptr_TestNode,0x1907);
  tcu::TestNode::addChild(node,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x90);
  FboCases::RepeatedClearCase::RepeatedClearCase
            ((RepeatedClearCase *)pTVar6,(Context *)pTVar5[1]._vptr_TestNode,0x1908);
  tcu::TestNode::addChild(node,pTVar6);
  return extraout_EAX;
}

Assistant:

void FboRenderTestGroup::init (void)
{
	createChildGroup<FboCases::ColorClearsTest>					(this, "color_clear",		"Color buffer clears");
	createChildGroup<FboCases::StencilClearsTest>				(this, "stencil_clear",		"Stencil buffer clears");

	deqp::gles2::TestCaseGroup* colorGroup = new deqp::gles2::TestCaseGroup(m_context, "color", "Color buffer tests");
	addChild(colorGroup);
	addChildVariants<FboCases::MixTest>			(colorGroup);
	addChildVariants<FboCases::MixNpotTest>		(colorGroup);
	addChildVariants<FboCases::BlendTest>		(colorGroup);
	addChildVariants<FboCases::BlendNpotTest>	(colorGroup);

	deqp::gles2::TestCaseGroup* depthGroup = new deqp::gles2::TestCaseGroup(m_context, "depth", "Depth bufer tests");
	addChild(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsTest>		(depthGroup);
	addChildVariants<FboCases::IntersectingQuadsNpotTest>	(depthGroup);

	deqp::gles2::TestCaseGroup* stencilGroup = new deqp::gles2::TestCaseGroup(m_context, "stencil", "Stencil buffer tests");
	addChild(stencilGroup);
	addChildVariants<FboCases::StencilTest>		(stencilGroup);
	addChildVariants<FboCases::StencilNpotTest>	(stencilGroup);

	createChildGroup<FboCases::SharedColorbufferClearsTest>		(this, "shared_colorbuffer_clear",	"Shared colorbuffer clears");
	createChildGroup<FboCases::SharedColorbufferTest>			(this, "shared_colorbuffer",		"Shared colorbuffer tests");
	createChildGroup<FboCases::SharedDepthbufferTest>			(this, "shared_depthbuffer",		"Shared depthbuffer tests");
	createChildGroup<FboCases::ResizeTest>						(this, "resize",					"FBO resize tests");

	createRecreateBuffersGroup<GL_COLOR_BUFFER_BIT>				(this, "recreate_colorbuffer",		"Recreate colorbuffer tests");
	createRecreateBuffersGroup<GL_DEPTH_BUFFER_BIT>				(this, "recreate_depthbuffer",		"Recreate depthbuffer tests");
	createRecreateBuffersGroup<GL_STENCIL_BUFFER_BIT>			(this, "recreate_stencilbuffer",	"Recreate stencilbuffer tests");

	deqp::gles2::TestCaseGroup* texSubImageGroup = new deqp::gles2::TestCaseGroup(m_context, "texsubimage", "TexSubImage interop with FBO colorbuffer texture");
	addChild(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageAfterRenderTest>		(texSubImageGroup);
	addChildVariants<FboCases::TexSubImageBetweenRenderTest>	(texSubImageGroup);

	{
		tcu::TestCaseGroup* const repeatedClearGroup = new tcu::TestCaseGroup(m_testCtx, "repeated_clear", "Repeated FBO clears");
		addChild(repeatedClearGroup);

		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGB));
		repeatedClearGroup->addChild(new FboCases::RepeatedClearCase(m_context, GL_RGBA));
	}
}